

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780AnalyzerResults.cpp
# Opt level: O3

void __thiscall
HD44780AnalyzerResults::GenerateFrameTabularText
          (HD44780AnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  ushort uVar1;
  size_t sVar2;
  HD44780AnalyzerResults *this_00;
  Frame frame;
  char s1 [256];
  char number_str [128];
  char s2 [256];
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  ulonglong local_2b8;
  undefined8 uStack_2b0;
  ushort local_2a8;
  HD44780AnalyzerResults local_298 [8];
  undefined8 local_198;
  undefined8 uStack_190;
  ulonglong local_188;
  undefined8 uStack_180;
  ushort local_178;
  char local_118 [256];
  
  AnalyzerResults::ClearTabularText();
  Frame::Frame((Frame *)&local_2c8);
  AnalyzerResults::GetFrame((ulonglong)&local_198);
  local_2a8 = local_178;
  local_2b8 = local_188;
  uStack_2b0 = uStack_180;
  local_2c8 = local_198;
  uStack_2c0 = uStack_190;
  Frame::~Frame((Frame *)&local_198);
  AnalyzerHelpers::GetNumberString(local_2b8,display_base,8,(char *)&local_198,0x80);
  uVar1 = local_2a8;
  if ((local_2a8 & 0x200) == 0) {
    local_298[0]._4_2_ = 0x2065;
    local_298[0]._6_1_ = 0;
    local_298[0].super_AnalyzerResults = (AnalyzerResults)0x57;
    local_298[0]._1_3_ = 0x746972;
  }
  else {
    local_298[0]._4_2_ = 0x20;
    local_298[0].super_AnalyzerResults = (AnalyzerResults)0x52;
    local_298[0]._1_3_ = 0x646165;
  }
  sVar2 = strlen((char *)local_298);
  if ((uVar1 & 0x100) == 0) {
    *(undefined8 *)(&local_298[0].super_AnalyzerResults + sVar2) = 0x20646e616d6d6f43;
    (&local_298[0].field_0x8)[sVar2] = 0;
  }
  else {
    *(undefined2 *)(&local_298[0].field_0x4 + sVar2) = 0x20;
    *(undefined4 *)(&local_298[0].super_AnalyzerResults + sVar2) = 0x61746144;
  }
  this_00 = local_298;
  strcat((char *)this_00,(char *)&local_198);
  HD44780Decode(this_00,(Frame *)&local_2c8,local_118,display_base);
  sVar2 = strlen((char *)local_298);
  *(undefined2 *)(&local_298[0].super_AnalyzerResults + sVar2) = 0x2820;
  (&local_298[0].field_0x2)[sVar2] = 0;
  strcat((char *)local_298,local_118);
  sVar2 = strlen((char *)local_298);
  *(undefined2 *)(&local_298[0].super_AnalyzerResults + sVar2) = 0x29;
  AnalyzerResults::AddTabularText
            ((char *)this,(char *)local_298,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame((Frame *)&local_2c8);
  return;
}

Assistant:

void HD44780AnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

    char s1[ 256 ], s2[ 256 ];
    Frame frame;

    frame = GetFrame( frame_index );

    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

    // string 4
    if( frame.mFlags & _BV( MFLAG_RW ) )
        strcpy( s1, "Read " );
    else
        strcpy( s1, "Write " );

    if( frame.mFlags & _BV( MFLAG_RS ) )
        strcat( s1, "Data " );
    else
        strcat( s1, "Command " );

    strcat( s1, number_str );

    // string 5 (adds to string 4)
    HD44780Decode( &frame, s2, display_base );
    strcat( s1, " (" );
    strcat( s1, s2 );
    strcat( s1, ")" );
    // AddResultString( s1 );

    AddTabularText( s1 );
}